

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void SaveOpndValue(ParseNode *pnode,FuncInfo *funcInfo)

{
  RegSlot RVar1;
  RegSlot RVar2;
  ParseNodeName *pPVar3;
  ParseNodeUni *pPVar4;
  Scope *this;
  FuncInfo *pFVar5;
  ParseNode *pnode1;
  Symbol *sym;
  FuncInfo *funcInfo_local;
  ParseNode *pnode_local;
  
  pnode1 = (ParseNode *)0x0;
  if (pnode->nop == knopName) {
    pPVar3 = ParseNode::AsParseNodeName(pnode);
    pnode1 = (ParseNode *)pPVar3->sym;
  }
  else if (pnode->nop == knopComputedName) {
    pPVar4 = ParseNode::AsParseNodeUni(pnode);
    if (pPVar4->pnode1->nop == knopName) {
      pPVar3 = ParseNode::AsParseNodeName(pPVar4->pnode1);
      pnode1 = (ParseNode *)pPVar3->sym;
    }
  }
  if ((pnode1 != (ParseNode *)0x0) && (pnode->location != 0xffffffff)) {
    this = Symbol::GetScope((Symbol *)pnode1);
    pFVar5 = Scope::GetFunc(this);
    if ((pFVar5 == funcInfo) &&
       (RVar2 = pnode->location, RVar1 = Symbol::GetLocation((Symbol *)pnode1), RVar2 == RVar1)) {
      RVar2 = FuncInfo::AcquireTmpRegister(funcInfo);
      pnode->location = RVar2;
    }
  }
  return;
}

Assistant:

void SaveOpndValue(ParseNode *pnode, FuncInfo *funcInfo)
{
    // Save a local name to a register other than its home location.
    // This guards against side-effects in cases like x.foo(x = bar()).
    Symbol *sym = nullptr;
    if (pnode->nop == knopName)
    {
        sym = pnode->AsParseNodeName()->sym;
    }
    else if (pnode->nop == knopComputedName)
    {
        ParseNode *pnode1 = pnode->AsParseNodeUni()->pnode1;
        if (pnode1->nop == knopName)
        {
            sym = pnode1->AsParseNodeName()->sym;
        }
    }

    if (sym == nullptr)
    {
        return;
    }

    // If the target is a local being kept in its home location,
    // protect the target's value in the event the home location is overwritten.
    if (pnode->location != Js::Constants::NoRegister &&
        sym->GetScope()->GetFunc() == funcInfo &&
        pnode->location == sym->GetLocation())
    {
        pnode->location = funcInfo->AcquireTmpRegister();
    }
}